

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

int cppcms::b64url::decoded_size(size_t s)

{
  uint uVar1;
  size_t s_local;
  undefined4 local_4;
  
  uVar1 = (uint)s & 3;
  if (uVar1 == 1) {
    local_4 = -1;
  }
  else if (uVar1 == 2) {
    local_4 = (int)(s >> 2) * 3 + 1;
  }
  else if (uVar1 == 3) {
    local_4 = (int)(s >> 2) * 3 + 2;
  }
  else {
    local_4 = (int)(s >> 2) * 3;
  }
  return local_4;
}

Assistant:

int decoded_size(size_t s)
{
	switch(s % 4) {
	case 1: return -1; // invalid
	case 2: return s/4*3+1;
	case 3: return s/4*3+2;
	default:
		return s/4*3;
	}
}